

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_pubkey_load(secp256k1_context *ctx,secp256k1_ge *ge,secp256k1_pubkey *pubkey)

{
  int iVar1;
  
  secp256k1_ge_from_bytes(ge,pubkey->data);
  iVar1 = secp256k1_fe_impl_is_zero(&ge->x);
  if (iVar1 != 0) {
    (*(ctx->illegal_callback).fn)("!secp256k1_fe_is_zero(&ge->x)",(ctx->illegal_callback).data);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

static int secp256k1_pubkey_load(const secp256k1_context* ctx, secp256k1_ge* ge, const secp256k1_pubkey* pubkey) {
    secp256k1_ge_from_bytes(ge, pubkey->data);
    ARG_CHECK(!secp256k1_fe_is_zero(&ge->x));
    return 1;
}